

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O1

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::UnChain
          (StringBuilder<Memory::ArenaAllocator> *this,char16 *pBuf,charcount_t bufLen)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Data *pDVar5;
  Data **ppDVar6;
  Data *src;
  charcount_t cVar7;
  charcount_t *pcVar8;
  
  cVar7 = this->count;
  if (this->secondChunk == (Data *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0xe0,"(this->IsChained())","this->IsChained()");
    if (!bVar3) goto LAB_0076396b;
    *puVar4 = 0;
  }
  if (bufLen < this->count) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0xe2,"(bufLen >= this->count)","bufLen >= this->count");
    if (!bVar3) {
LAB_0076396b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  src = this->firstChunk;
  pDVar5 = this->lastChunk;
  if (src != pDVar5) {
    ppDVar6 = &this->secondChunk;
    pcVar8 = &this->firstChunkLength;
    do {
      uVar1 = *pcVar8;
      if (bufLen < uVar1) goto LAB_00763961;
      pcVar8 = (charcount_t *)*ppDVar6;
      js_wmemcpy_s(pBuf,(ulong)bufLen,(char16 *)src,(ulong)uVar1);
      bufLen = bufLen - uVar1;
      pBuf = pBuf + uVar1;
      cVar7 = cVar7 - uVar1;
      src = (Data *)(pcVar8 + 4);
      ppDVar6 = (Data **)(pcVar8 + 2);
      pDVar5 = this->lastChunk;
    } while ((Data *)pcVar8 != pDVar5);
  }
  if (cVar7 <= bufLen) {
    js_wmemcpy_s(pBuf,(ulong)bufLen,(char16 *)(pDVar5 + 1),(ulong)cVar7);
    return;
  }
LAB_00763961:
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void UnChain(__out __ecount(bufLen) char16 *pBuf, charcount_t bufLen)
        {
            charcount_t lastChunkCount = this->count;

            Assert(this->IsChained());

            Assert(bufLen >= this->count);
            char16 *pSrcBuf = this->firstChunk->u.single.buffer;
            Data *next = this->secondChunk;
            charcount_t srcLength = this->firstChunkLength;

            for (Data *chunk = this->firstChunk; chunk != this->lastChunk; next = chunk->u.chained.next)
            {
                if (bufLen < srcLength)
                {
                    Throw::FatalInternalError();
                }
                js_wmemcpy_s(pBuf, bufLen, pSrcBuf, srcLength);
                bufLen -= srcLength;
                pBuf += srcLength;
                lastChunkCount -= srcLength;

                chunk = next;
                pSrcBuf = chunk->u.chained.buffer;
                srcLength = chunk->u.chained.length;
            }

            if (bufLen < lastChunkCount)
            {
                Throw::FatalInternalError();
            }
            js_wmemcpy_s(pBuf, bufLen, this->lastChunk->u.chained.buffer, lastChunkCount);
        }